

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void uv__stream_eof(uv_stream_t *stream,uv_buf_t *buf)

{
  uint *puVar1;
  uint uVar2;
  
  stream->flags = stream->flags & 0xffffa7ff | 0x800;
  uv__io_stop(stream->loop,&stream->io_watcher,1);
  uVar2 = stream->flags;
  if (((uVar2 & 4) != 0) && (stream->flags = uVar2 & 0xfffffffb, (uVar2 & 8) != 0)) {
    puVar1 = &stream->loop->active_handles;
    *puVar1 = *puVar1 - 1;
  }
  (*stream->read_cb)(stream,-0xfff,buf);
  return;
}

Assistant:

static void uv__stream_eof(uv_stream_t* stream, const uv_buf_t* buf) {
  stream->flags |= UV_HANDLE_READ_EOF;
  stream->flags &= ~UV_HANDLE_READING;
  stream->flags &= ~UV_HANDLE_READABLE;
  uv__io_stop(stream->loop, &stream->io_watcher, POLLIN);
  uv__handle_stop(stream);
  uv__stream_osx_interrupt_select(stream);
  stream->read_cb(stream, UV_EOF, buf);
}